

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<17>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  uint32 value;
  int *piVar1;
  CodedOutputStream *output_local;
  void *ptr_local;
  
  piVar1 = Get<int>(ptr);
  value = WireFormatLite::ZigZagEncode32(*piVar1);
  io::CodedOutputStream::WriteVarint32(output,value);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteSInt32NoTag(Get<int32>(ptr), output);
  }